

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  FILE *__s;
  FILE *pfile;
  char *premature_exit_filepath_local;
  ScopedPrematureExitFile *this_local;
  
  this->premature_exit_filepath_ = premature_exit_filepath;
  if ((premature_exit_filepath != (char *)0x0) && (*premature_exit_filepath != '\0')) {
    __s = (FILE *)posix::FOpen(premature_exit_filepath,"w");
    fwrite("0",1,1,__s);
    fclose(__s);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(premature_exit_filepath) {
    // If a path to the premature-exit file is specified...
    if (premature_exit_filepath != NULL && *premature_exit_filepath != '\0') {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath, "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }